

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transactions.cpp
# Opt level: O0

RPCHelpMan * wallet::abandontransaction(void)

{
  initializer_list<RPCArg> __l;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_fffffffffffffa68;
  RPCArg *this;
  anon_class_1_0_00000001 *in_stack_fffffffffffffa70;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffffa78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffaa0;
  allocator<char> *in_stack_fffffffffffffaa8;
  undefined1 *puVar2;
  iterator in_stack_fffffffffffffab0;
  RPCArgOptions *in_stack_fffffffffffffab8;
  string *in_stack_fffffffffffffac0;
  Fallback *in_stack_fffffffffffffac8;
  undefined1 skip_type_check;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffffad0;
  string *in_stack_fffffffffffffad8;
  RPCArg *in_stack_fffffffffffffae0;
  RPCResult *result;
  RPCResults *this_00;
  RPCResult *this_01;
  allocator<char> local_46c;
  allocator<char> local_46b;
  allocator<char> local_46a;
  allocator<char> local_469;
  pointer local_468;
  _Alloc_hider _Stack_460;
  pointer local_458;
  undefined8 in_stack_fffffffffffffbb0;
  undefined8 in_stack_fffffffffffffbb8;
  undefined8 in_stack_fffffffffffffbc0;
  undefined8 in_stack_fffffffffffffbc8;
  undefined8 in_stack_fffffffffffffbd0;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffbdc;
  allocator<char> local_402;
  allocator<char> local_401 [209];
  RPCMethodImpl *in_stack_fffffffffffffcd0;
  undefined1 local_150 [264];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffab8,(char *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffab8,(char *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffab8,(char *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
  uVar3 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffffa78,(Optional *)in_stack_fffffffffffffa70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffab8,(char *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
  std::__cxx11::string::string(in_stack_fffffffffffffa80);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffa68);
  RPCArg::RPCArg(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,
                 (Type)((ulong)in_stack_fffffffffffffad0 >> 0x20),in_stack_fffffffffffffac8,
                 in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  skip_type_check = (undefined1)((ulong)in_stack_fffffffffffffac8 >> 0x38);
  std::allocator<RPCArg>::allocator(in_stack_fffffffffffffa68);
  __l._M_len = (size_type)in_stack_fffffffffffffab8;
  __l._M_array = in_stack_fffffffffffffab0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffffaa8,__l,
             (allocator_type *)in_stack_fffffffffffffaa0);
  this_01 = (RPCResult *)&stack0xfffffffffffffbb7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffab8,(char *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
  this_00 = (RPCResults *)&stack0xfffffffffffffbb6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffab8,(char *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
  local_468 = (pointer)0x0;
  _Stack_460._M_p = (pointer)0x0;
  local_458 = (pointer)0x0;
  result = (RPCResult *)&local_468;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffffa68);
  RPCResult::RPCResult
            (this_01,(Type)((ulong)this_00 >> 0x20),(string *)result,in_stack_fffffffffffffad8,
             in_stack_fffffffffffffad0,(bool)skip_type_check);
  RPCResults::RPCResults(this_00,result);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffab8,(char *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffab8,(char *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
  HelpExampleCli(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffab8,(char *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffab8,(char *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
  HelpExampleRpc(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
  std::operator+(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffffa68,(string *)0x186f6f0);
  this = (RPCArg *)&stack0xfffffffffffffb70;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::abandontransaction()::__0,void>
            (in_stack_fffffffffffffa78,in_stack_fffffffffffffa70);
  RPCHelpMan::RPCHelpMan
            ((RPCHelpMan *)CONCAT44(in_stack_fffffffffffffbdc,uVar3),
             (string *)in_stack_fffffffffffffbd0,(string *)in_stack_fffffffffffffbc8,
             (vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffffbc0,
             (RPCResults *)in_stack_fffffffffffffbb8,(RPCExamples *)in_stack_fffffffffffffbb0,
             in_stack_fffffffffffffcd0);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_46c);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_46b);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_46a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_469);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffffa78);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffbb6);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffbb7);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffffa78);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  puVar2 = local_150;
  puVar1 = local_48;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this);
  } while (puVar1 != puVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffbd7);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffbdf);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_402);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_401);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan abandontransaction()
{
    return RPCHelpMan{"abandontransaction",
                "\nMark in-wallet transaction <txid> as abandoned\n"
                "This will mark this transaction and all its in-wallet descendants as abandoned which will allow\n"
                "for their inputs to be respent.  It can be used to replace \"stuck\" or evicted transactions.\n"
                "It only works on transactions which are not included in a block and are not currently in the mempool.\n"
                "It has no effect on transactions which are already abandoned.\n",
                {
                    {"txid", RPCArg::Type::STR_HEX, RPCArg::Optional::NO, "The transaction id"},
                },
                RPCResult{RPCResult::Type::NONE, "", ""},
                RPCExamples{
                    HelpExampleCli("abandontransaction", "\"1075db55d416d3ca199f55b6084e2115b9345e16c5cf302fc80e9d5fbf5d48d\"")
            + HelpExampleRpc("abandontransaction", "\"1075db55d416d3ca199f55b6084e2115b9345e16c5cf302fc80e9d5fbf5d48d\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    std::shared_ptr<CWallet> const pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    // Make sure the results are valid at least up to the most recent block
    // the user could have gotten from another RPC command prior to now
    pwallet->BlockUntilSyncedToCurrentChain();

    LOCK(pwallet->cs_wallet);

    uint256 hash(ParseHashV(request.params[0], "txid"));

    if (!pwallet->mapWallet.count(hash)) {
        throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Invalid or non-wallet transaction id");
    }
    if (!pwallet->AbandonTransaction(hash)) {
        throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Transaction not eligible for abandonment");
    }

    return UniValue::VNULL;
},
    };
}